

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

EVsource INT_EVcreate_submit_handle_free
                   (CManager_conflict cm,EVstone stone,FMStructDescList data_format,
                   EVFreeFunction free_func,void *free_data)

{
  CManager_conflict cm_00;
  CMFormat p_Var1;
  FMFormat p_Var2;
  CMControlList in_RCX;
  undefined4 in_ESI;
  transport_entry_conflict *in_RDI;
  CManager in_R8;
  EVsource source;
  FMStructDescList in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  cm_00 = (CManager_conflict)INT_CMmalloc(in_stack_ffffffffffffffd0);
  memset(cm_00,0,0x30);
  cm_00->CManager_ID = in_ESI;
  cm_00->transports = in_RDI;
  p_Var1 = INT_CMregister_format(in_R8,(FMStructDescList)cm_00);
  *(CMFormat *)&cm_00->initialized = p_Var1;
  p_Var2 = EVregister_format_set(cm_00,in_stack_ffffffffffffffc8);
  cm_00->control_module_choice = (char *)p_Var2;
  cm_00->control_list = in_RCX;
  *(CManager *)&cm_00->in_format_count = in_R8;
  *(int *)&cm_00->field_0x1c = 0;
  return (EVsource)cm_00;
}

Assistant:

extern EVsource
INT_EVcreate_submit_handle_free(CManager cm, EVstone stone, 
			    FMStructDescList data_format, 
			    EVFreeFunction free_func, void *free_data)
{
    EVsource source = malloc(sizeof(*source));
    memset(source, 0, sizeof(*source));
    source->local_stone_id = stone;
    source->cm = cm;
    source->format = INT_CMregister_format(cm, data_format);
    source->reference_format = EVregister_format_set(cm, data_format);
    source->free_func = free_func;
    source->free_data = free_data;
    source->preencoded = 0;
    return source;
}